

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.h
# Opt level: O0

void __thiscall
r_exec::Input::Input(Input *this,View *input,_Fact *abstraction,BindingMap *bindings)

{
  bool bVar1;
  _Fact *o;
  uint64_t uVar2;
  BindingMap *bindings_local;
  _Fact *abstraction_local;
  View *input_local;
  Input *this_local;
  
  core::P<r_exec::BindingMap>::P(&this->bindings,bindings);
  core::P<r_exec::_Fact>::P(&this->abstraction,abstraction);
  o = core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
  core::P<r_exec::_Fact>::P(&this->input,o);
  bVar1 = IsEligibleCause(input);
  this->eligible_cause = bVar1;
  uVar2 = r_code::View::get_ijt(&input->super_View);
  this->ijt = uVar2;
  return;
}

Assistant:

Input(View *input, _Fact *abstraction, BindingMap *bindings): bindings(bindings), abstraction(abstraction), input(input->object), eligible_cause(IsEligibleCause(input)), ijt(input->get_ijt()) {}